

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::ConsoleReporter::sectionEnded(ConsoleReporter *this,SectionStats *_sectionStats)

{
  double duration;
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  Colour colour;
  
  pcVar3 = (char *)_sectionStats;
  TablePrinter::close((this->m_tablePrinter)._M_t.
                      super___uniq_ptr_impl<Catch::TablePrinter,_std::default_delete<Catch::TablePrinter>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Catch::TablePrinter_*,_std::default_delete<Catch::TablePrinter>_>
                      .super__Head_base<0UL,_Catch::TablePrinter_*,_false>._M_head_impl,
                      (int)_sectionStats);
  if (_sectionStats->missingAssertions == true) {
    lazyPrint(this);
    colour.m_moved = false;
    Colour::use(BrightRed);
    pcVar3 = "\nNo assertions in test case";
    if (1 < (ulong)(((long)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).
                           m_sectionStack.
                           super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack
                          .
                          super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x50)) {
      pcVar3 = "\nNo assertions in section";
    }
    std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,pcVar3);
    poVar2 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                             " \'");
    poVar2 = std::operator<<(poVar2,(string *)&_sectionStats->sectionInfo);
    pcVar3 = "\'\n";
    poVar2 = std::operator<<(poVar2,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar2);
    Colour::~Colour(&colour);
  }
  duration = _sectionStats->durationInSeconds;
  bVar1 = shouldShowDuration((this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_config.
                             super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr,duration);
  if (bVar1) {
    poVar2 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
    getFormattedDuration_abi_cxx11_((string *)&colour,(Catch *)pcVar3,duration);
    poVar2 = std::operator<<(poVar2,(string *)&colour);
    poVar2 = std::operator<<(poVar2," s: ");
    poVar2 = std::operator<<(poVar2,(string *)&_sectionStats->sectionInfo);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&colour);
  }
  if (this->m_headerPrinted == true) {
    this->m_headerPrinted = false;
  }
  clara::std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::pop_back
            (&(this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack);
  return;
}

Assistant:

void ConsoleReporter::sectionEnded(SectionStats const& _sectionStats) {
    m_tablePrinter->close();
    if (_sectionStats.missingAssertions) {
        lazyPrint();
        Colour colour(Colour::ResultError);
        if (m_sectionStack.size() > 1)
            stream << "\nNo assertions in section";
        else
            stream << "\nNo assertions in test case";
        stream << " '" << _sectionStats.sectionInfo.name << "'\n" << std::endl;
    }
    double dur = _sectionStats.durationInSeconds;
    if (shouldShowDuration(*m_config, dur)) {
        stream << getFormattedDuration(dur) << " s: " << _sectionStats.sectionInfo.name << std::endl;
    }
    if (m_headerPrinted) {
        m_headerPrinted = false;
    }
    StreamingReporterBase::sectionEnded(_sectionStats);
}